

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rendering_buffer.h
# Opt level: O0

void __thiscall
agg::row_accessor<unsigned_char>::attach
          (row_accessor<unsigned_char> *this,uchar *buf,uint width,uint height,int stride)

{
  int stride_local;
  uint height_local;
  uint width_local;
  uchar *buf_local;
  row_accessor<unsigned_char> *this_local;
  
  this->m_start = buf;
  this->m_buf = buf;
  this->m_width = width;
  this->m_height = height;
  this->m_stride = stride;
  if (stride < 0) {
    this->m_start = this->m_buf + -(long)(int)((height - 1) * stride);
  }
  return;
}

Assistant:

void attach(T* buf, unsigned width, unsigned height, int stride)
        {
            m_buf = m_start = buf;
            m_width = width;
            m_height = height;
            m_stride = stride;
            if(stride < 0) 
            { 
                m_start = m_buf - int(height - 1) * stride;
            }
        }